

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameStage.cpp
# Opt level: O3

void __thiscall GameOverStage::GameOverStage(GameOverStage *this)

{
  _Head_base<0UL,_TextPrinter_*,_false> __ptr_00;
  GLFWwindow *handle;
  _Head_base<0UL,_TextPrinter_*,_false> this_00;
  pointer *__ptr;
  unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_> *this_01;
  int height;
  int width;
  string local_68;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_48;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_38;
  
  (this->super_GameStage)._vptr_GameStage = (_func_int **)&PTR_renderFrame_001aa320;
  (this->m_text)._M_t.super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>._M_t.
  super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
  super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl = (TextPrinter *)0x0;
  this_01 = &this->m_text;
  glClearColor(0x3f800000,0x3f333333,0x3ecccccd,0x3f800000);
  handle = glfwGetCurrentContext();
  glfwGetFramebufferSize(handle,&width,&height);
  this_00._M_head_impl = (TextPrinter *)operator_new(0x90);
  TextPrinter::TextPrinter(this_00._M_head_impl,width,height);
  __ptr_00._M_head_impl =
       (this_01->_M_t).super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>._M_t.
       super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
       super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl;
  (this_01->_M_t).super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>._M_t.
  super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
  super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl = this_00._M_head_impl;
  if (__ptr_00._M_head_impl != (TextPrinter *)0x0) {
    std::default_delete<TextPrinter>::operator()
              ((default_delete<TextPrinter> *)this_01,__ptr_00._M_head_impl);
    this_00._M_head_impl =
         (this_01->_M_t).super___uniq_ptr_impl<TextPrinter,_std::default_delete<TextPrinter>_>._M_t.
         super__Tuple_impl<0UL,_TextPrinter_*,_std::default_delete<TextPrinter>_>.
         super__Head_base<0UL,_TextPrinter_*,_false>._M_head_impl;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"GAME OVER!","");
  local_48._0_8_ = 0x3f800000;
  local_48.field_0.z = 0.0;
  local_38._0_8_ = 0x3f8000003f800000;
  local_38._8_8_ = 0x3f800000;
  TextPrinter::printText
            (this_00._M_head_impl,&local_68,0,3,10,(vec3 *)&local_48.field_0,
             (vec4 *)&local_38.field_0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

GameOverStage::GameOverStage()
{
  glClearColor(1, 0.7, 0.4, 1);
  int width, height;
  GLFWwindow * window = glfwGetCurrentContext();
  glfwGetFramebufferSize(window, &width, &height);
  m_text = std::unique_ptr<TextPrinter>(new TextPrinter(width, height));
  m_text->printText("GAME OVER!", 0, 3, 10, glm::vec3(1, 0, 0));
}